

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O0

size_t highwayhash::MinRange<unsigned_int>(uint *sorted,size_t idx_begin,size_t half_count)

{
  size_t sStack_38;
  uint range;
  size_t idx;
  size_t min_idx;
  uint min_range;
  size_t half_count_local;
  size_t idx_begin_local;
  uint *sorted_local;
  
  min_idx._4_4_ = std::numeric_limits<unsigned_int>::max();
  idx = 0;
  sStack_38 = idx_begin;
  while( true ) {
    if (idx_begin + half_count <= sStack_38) {
      return idx;
    }
    if (sorted[sStack_38 + half_count] < sorted[sStack_38]) break;
    if (sorted[sStack_38 + half_count] - sorted[sStack_38] < min_idx._4_4_) {
      idx = sStack_38;
      min_idx._4_4_ = sorted[sStack_38 + half_count] - sorted[sStack_38];
    }
    sStack_38 = sStack_38 + 1;
  }
  __assert_fail("sorted[idx] <= sorted[idx + half_count]",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                ,0x29,
                "size_t highwayhash::MinRange(const T *const __restrict, const size_t, const size_t) [T = unsigned int]"
               );
}

Assistant:

size_t MinRange(const T* const HH_RESTRICT sorted, const size_t idx_begin,
                const size_t half_count) {
  T min_range = std::numeric_limits<T>::max();
  size_t min_idx = 0;

  for (size_t idx = idx_begin; idx < idx_begin + half_count; ++idx) {
    assert(sorted[idx] <= sorted[idx + half_count]);
    const T range = sorted[idx + half_count] - sorted[idx];
    if (range < min_range) {
      min_range = range;
      min_idx = idx;
    }
  }

  return min_idx;
}